

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printT2SOOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  ARM_AM_ShiftOpc AVar4;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar5;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Reg;
  MCOperand *MO2;
  MCOperand *MO1;
  undefined8 in_stack_ffffffffffffffc0;
  uint RegNo;
  SStream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  RegNo = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  op = MCInst_getOperand(in_RDI,in_ESI);
  op_00 = MCInst_getOperand(in_RDI,in_ESI + 1);
  uVar3 = MCOperand_getReg(op);
  printRegName((cs_struct *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               RegNo);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar3;
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  iVar5 = MCOperand_getImm(op_00);
  AVar4 = ARM_AM_getSORegShOp((uint)iVar5);
  iVar5 = MCOperand_getImm(op_00);
  getSORegOffset((uint)iVar5);
  printRegImmShift((MCInst *)CONCAT44(uVar3,AVar4),in_RDX,(ARM_AM_ShiftOpc)((ulong)in_RDI >> 0x20),
                   (uint)in_RDI);
  return;
}

Assistant:

static void printT2SOOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);

	unsigned Reg = MCOperand_getReg(MO1);
	printRegName(MI->csh, O, Reg);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = Reg;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
		MI->flat_insn->detail->arm.op_count++;
	}

	// Print the shift opc.
	//assert(MO2.isImm() && "Not a valid t2_so_reg value!");
	printRegImmShift(MI, O, ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2)),
			getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
}